

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs-libc.c
# Opt level: O0

JSValue js_std_getenv(JSContext *ctx,JSValue this_val,int argc,JSValue *argv)

{
  JSValue val1;
  char *pcVar1;
  undefined4 in_ECX;
  char *in_R8;
  JSValue JVar2;
  char *str;
  char *name;
  JSValueUnion in_stack_ffffffffffffffb8;
  int64_t in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffd0;
  undefined1 local_10 [16];
  
  val1.tag = in_stack_ffffffffffffffc0;
  val1.u.float64 = in_stack_ffffffffffffffb8.float64;
  pcVar1 = JS_ToCString((JSContext *)0x1108b2,val1);
  if (pcVar1 == (char *)0x0) {
    local_10._0_8_ = local_10._4_8_ << 0x20;
    local_10._8_8_ = 6;
  }
  else {
    pcVar1 = getenv(pcVar1);
    JS_FreeCString((JSContext *)CONCAT44(in_ECX,in_stack_ffffffffffffffd0),in_R8);
    if (pcVar1 == (char *)0x0) {
      local_10._0_8_ = local_10._4_8_ << 0x20;
      local_10._8_8_ = 3;
    }
    else {
      local_10 = (undefined1  [16])
                 JS_NewString((JSContext *)CONCAT44(in_ECX,in_stack_ffffffffffffffd0),in_R8);
    }
  }
  JVar2.u = (JSValueUnion)local_10._0_8_;
  JVar2.tag = local_10._8_8_;
  return JVar2;
}

Assistant:

static JSValue js_std_getenv(JSContext *ctx, JSValueConst this_val,
                           int argc, JSValueConst *argv)
{
    const char *name, *str;
    name = JS_ToCString(ctx, argv[0]);
    if (!name)
        return JS_EXCEPTION;
    str = getenv(name);
    JS_FreeCString(ctx, name);
    if (!str)
        return JS_UNDEFINED;
    else
        return JS_NewString(ctx, str);
}